

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingScene::AreaLightSource
          (FormattingScene *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Float FVar3;
  Float totalScale;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffd68;
  ParameterDictionary *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  ParameterDictionary *in_stack_fffffffffffffd88;
  string *name_00;
  RGBColorSpace *in_stack_fffffffffffffd90;
  int extra_00;
  FormattingScene *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  string local_238 [28];
  int in_stack_fffffffffffffde4;
  ParameterDictionary *in_stack_fffffffffffffde8;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [16];
  undefined8 in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  string local_140 [36];
  float local_11c;
  string local_118 [280];
  
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffd70);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->params,
                  (polymorphic_allocator<pbrt::ParsedParameter_*> *)
                  CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  ParameterDictionary::ParameterDictionary
            ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (ParsedParameterVector *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffd70->params);
  std::__cxx11::string::string(local_118);
  local_11c = 1.0;
  if (((in_RDI->field_2)._M_local_buf[1] & 1U) == 0) {
    indent_abi_cxx11_(in_stack_fffffffffffffd98,(int)((ulong)in_stack_fffffffffffffd90 >> 0x20));
    extra_00 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_RDX,in_RDI,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::__cxx11::string::~string(local_1f8);
  }
  else {
    in_stack_fffffffffffffda7 =
         upgradeRGBToScale((ParameterDictionary *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           in_stack_fffffffffffffeb0,(Float *)in_stack_fffffffffffffea8);
    if (!(bool)in_stack_fffffffffffffda7) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDX,(char *)in_RDI,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      ParameterDictionary::loc
                (in_stack_fffffffffffffd88,
                 (string *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
      SceneRepresentation::ErrorExitDeferred<>
                ((SceneRepresentation *)in_stack_fffffffffffffd70,
                 (FileLoc *)in_stack_fffffffffffffd68,(char *)0x9dc1d6);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
      goto LAB_009dc640;
    }
    name_00 = (string *)&local_169;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,(char *)in_RDI,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    FVar3 = ParameterDictionary::UpgradeBlackbody
                      ((ParameterDictionary *)in_stack_fffffffffffffd90,name_00);
    extra_00 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
    local_11c = local_11c * FVar3;
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    if (bVar1) {
      indent_abi_cxx11_(in_stack_fffffffffffffd98,extra_00);
      Printf<std::__cxx11::string>
                ((char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_190);
    }
    else {
      indent_abi_cxx11_(in_stack_fffffffffffffd98,extra_00);
      Printf<std::__cxx11::string,std::__cxx11::string_const&>
                ((char *)in_RDX,in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
      std::__cxx11::string::~string(local_1b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDX,(char *)in_RDI,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    ParameterDictionary::RemoveInt(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  if ((local_11c != 1.0) || (NAN(local_11c))) {
    indent_abi_cxx11_(in_stack_fffffffffffffd98,extra_00);
    Printf<std::__cxx11::string,float&>
              ((char *)in_RDX,in_RDI,
               (float *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,local_118);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  std::operator<<(poVar2,local_238);
  std::__cxx11::string::~string(local_238);
LAB_009dc640:
  std::__cxx11::string::~string(local_118);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x9dc65a);
  return;
}

Assistant:

void FormattingScene::AreaLightSource(const std::string &name,
                                      ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    std::string extra;
    Float totalScale = 1;
    if (upgrade) {
        if (!upgradeRGBToScale(&dict, "scale", &totalScale)) {
            ErrorExitDeferred(dict.loc("scale"),
                              "In pbrt-v4, \"scale\" is a \"float\" parameter "
                              "to light sources. "
                              "Please modify your scene file manually.");
            return;
        }

        totalScale *= dict.UpgradeBlackbody("L");

        if (name == "area")
            Printf("%sAreaLightSource \"diffuse\"\n", indent());
        else
            Printf("%sAreaLightSource \"%s\"\n", indent(), name);
        dict.RemoveInt("nsamples");
    } else
        Printf("%sAreaLightSource \"%s\"\n", indent(), name);

    if (totalScale != 1)
        Printf("%s\"float scale\" [%f]\n", indent(1), totalScale);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}